

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O2

int mk_fifo_worker_read(void *event)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  void *pvVar4;
  ssize_t sVar5;
  ulong uVar6;
  mk_fifo_queue *pmVar7;
  int iVar8;
  long lVar9;
  char *__s;
  size_t __size;
  
  lVar9 = *(long *)((long)event + 0x68);
  iVar8 = (int)*(long *)((long)event + 0x70) - (int)lVar9;
  if (iVar8 < 2) {
    __size = *(long *)((long)event + 0x70) + 0x4000;
    pvVar4 = realloc(*(void **)((long)event + 0x60),__size);
    if (pvVar4 == (void *)0x0 && __size != 0) {
      __s = "realloc";
      perror("realloc");
      goto LAB_0010627d;
    }
    if (pvVar4 == (void *)0x0) {
      __s = "realloc";
      goto LAB_0010627d;
    }
    *(void **)((long)event + 0x60) = pvVar4;
    *(size_t *)((long)event + 0x70) = __size;
    lVar9 = *(long *)((long)event + 0x68);
    iVar8 = (int)__size - (int)lVar9;
  }
  else {
    pvVar4 = *(void **)((long)event + 0x60);
  }
  sVar5 = read(*(int *)((long)event + 0x4c),(void *)(lVar9 + (long)pvVar4),(long)iVar8);
  if (sVar5 == 0) {
    return -1;
  }
  if (sVar5 != -1) {
    uVar6 = sVar5 + *(long *)((long)event + 0x68);
    *(ulong *)((long)event + 0x68) = uVar6;
    while( true ) {
      if (uVar6 == 0) {
        return 0;
      }
      puVar3 = *(uint **)((long)event + 0x60);
      uVar2 = *puVar3;
      if (uVar6 < (ulong)uVar2 + 8) break;
      uVar1 = *(ushort *)((long)puVar3 + 6);
      pmVar7 = mk_fifo_queue_get(*(mk_fifo **)((long)event + 0x78),(uint)uVar1);
      if (pmVar7 == (mk_fifo_queue *)0x0) {
        fprintf(_stderr,"[fifo worker read] invalid queue id %i\n",(ulong)(uint)uVar1);
      }
      else if (pmVar7->cb_message != (_func_void_mk_fifo_queue_ptr_void_ptr_size_t_void_ptr *)0x0) {
        (*pmVar7->cb_message)(pmVar7,puVar3 + 2,(ulong)uVar2,pmVar7->data);
      }
      fifo_drop_msg((mk_fifo_worker *)event);
      uVar6 = *(ulong *)((long)event + 0x68);
    }
    return 0;
  }
  __s = "read";
LAB_0010627d:
  perror(__s);
  return -1;
}

Assistant:

int mk_fifo_worker_read(void *event)
{
    int available;
    char *tmp;
    size_t size;
    ssize_t bytes;
    struct mk_fifo_msg *fm;
    struct mk_fifo_worker *fw;
    struct mk_fifo_queue *fq;

    fw = (struct mk_fifo_worker *) event;

    /* Check available space */
    available = fw->buf_size - fw->buf_len;
    if (available <= 1) {
        size = fw->buf_size + (MK_FIFO_BUF_SIZE / 2);
        tmp = mk_mem_realloc(fw->buf_data, size);
        if (!tmp) {
            perror("realloc");
            return -1;
        }
        fw->buf_data = tmp;
        fw->buf_size = size;
        available = fw->buf_size - fw->buf_len;
    }

    /* Read data from pipe */
#ifdef _WIN32
    bytes = recv(fw->channel[0], fw->buf_data + fw->buf_len, available, 0);
#else
    bytes = read(fw->channel[0], fw->buf_data + fw->buf_len, available);
#endif

    if (bytes == 0) {
        return -1;
    }
    else if (bytes == -1){
        perror("read");
        return -1;
    }

    fw->buf_len += bytes;

    /* Find messages and trigger callbacks */
    while (fw->buf_len > 0) {
        if (fifo_is_msg_ready(fw) == MK_TRUE) {
            /* we got a complete message */
            fm = (struct mk_fifo_msg *) fw->buf_data;
            fq = mk_fifo_queue_get(fw->fifo, fm->queue_id);
            if (!fq) {
                /* Invalid queue */
                fprintf(stderr, "[fifo worker read] invalid queue id %i\n",
                        fm->queue_id);
                fifo_drop_msg(fw);
                continue;
            }

            /* Trigger callback if any */
            if (fq->cb_message) {
                fq->cb_message(fq, fm->data, fm->length, fq->data);
            }
            fifo_drop_msg(fw);
        }
        else {
            /* msg not ready */
            break;
        }
    }

    return 0;
}